

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_workspace.cpp
# Opt level: O2

void * __thiscall ON_Workspace::GetMemory(ON_Workspace *this,size_t size)

{
  ON_Workspace_MBLK *pOVar1;
  void *pvVar2;
  
  if (size != 0) {
    pOVar1 = (ON_Workspace_MBLK *)onmalloc(0x10);
    if (pOVar1 == (ON_Workspace_MBLK *)0x0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = onmalloc(size);
      pOVar1->pMem = pvVar2;
      pOVar1->pNext = this->m_pMemBlk;
      this->m_pMemBlk = pOVar1;
    }
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

void* ON_Workspace::GetMemory( size_t size )
{
  void* p = nullptr;
  if ( size > 0 ) 
  {
    struct ON_Workspace_MBLK* pBlk = (struct ON_Workspace_MBLK*)onmalloc(sizeof(*pBlk));
    if ( pBlk ) 
    {
      pBlk->pMem = p = onmalloc(size);
      pBlk->pNext = m_pMemBlk;
      m_pMemBlk = pBlk;
    }
  }
  return p;
}